

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

int rnndec_varadd(rnndeccontext *ctx,char *varset,char *variant)

{
  int iVar1;
  rnnvalue **pprVar2;
  int iVar3;
  rnnenum *prVar4;
  rnndecvariant *prVar5;
  rnndecvariant **pprVar6;
  long lVar7;
  
  prVar4 = rnn_findenum(ctx->db,varset);
  if (prVar4 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    iVar1 = prVar4->valsnum;
    if (0 < (long)iVar1) {
      pprVar2 = prVar4->vals;
      lVar7 = 0;
      do {
        iVar3 = strcasecmp(pprVar2[lVar7]->name,variant);
        if (iVar3 == 0) {
          prVar5 = (rnndecvariant *)calloc(0x10,1);
          prVar5->en = prVar4;
          prVar5->variant = (int)lVar7;
          iVar1 = ctx->varsmax;
          if (iVar1 <= ctx->varsnum) {
            iVar3 = 0x10;
            if (iVar1 != 0) {
              iVar3 = iVar1 * 2;
            }
            ctx->varsmax = iVar3;
            pprVar6 = (rnndecvariant **)realloc(ctx->vars,(long)iVar3 << 3);
            ctx->vars = pprVar6;
          }
          iVar1 = ctx->varsnum;
          ctx->varsnum = iVar1 + 1;
          ctx->vars[iVar1] = prVar5;
          return 1;
        }
        lVar7 = lVar7 + 1;
      } while (iVar1 != lVar7);
    }
    fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",variant,varset);
  }
  return 0;
}

Assistant:

int rnndec_varadd(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}